

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

bool __thiscall
libtorrent::torrent_info::resolve_duplicate_filenames_slow
          (torrent_info *this,int max_duplicate_filenames,error_code *ec)

{
  char c;
  pointer pbVar1;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *crc_00;
  pointer pcVar2;
  libtorrent *this_00;
  size_t sVar3;
  uchar byte;
  bool bVar4;
  file_flags_t fVar5;
  int iVar6;
  uint32_t uVar7;
  long lVar8;
  size_type __bkt_count;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar9;
  _Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
  _Var10;
  int64_t iVar11;
  int64_t iVar12;
  iterator iVar13;
  char *pcVar14;
  int iVar15;
  size_type sVar16;
  char *in_R9;
  int iVar17;
  size_type sVar18;
  _Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
  _Var19;
  file_index_t fVar20;
  file_index_t index;
  pointer pbVar21;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar22;
  uint uVar23;
  ulong uVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  string_view str;
  string_view lhs;
  string_view s2;
  string_view str_00;
  string_view s1;
  string_view rhs;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> crc_1;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> crc;
  undefined4 uStack_154;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *local_150;
  uint32_t new_hash;
  uint32_t hash;
  string other_name;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> local_crc;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_b8;
  unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
  files;
  string ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  files._M_h._M_buckets = &files._M_h._M_single_bucket;
  files._M_h._M_bucket_count = 1;
  files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  files._M_h._M_element_count = 0;
  files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  files._M_h._M_rehash_policy._M_next_resize = 0;
  files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pbVar21 = (this->m_files).m_paths.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = (this->m_files).m_paths.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = file_storage::num_files(&this->m_files);
  lVar8 = (long)iVar6 + ((long)pbVar21 - (long)pbVar1 >> 5);
  auVar26._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar26._0_8_ = lVar8;
  auVar26._12_4_ = 0x45300000;
  dVar25 = (double)files._M_h._M_rehash_policy._M_max_load_factor;
  ceil(((auVar26._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) / dVar25);
  sVar3 = files._M_h._M_rehash_policy._M_next_resize;
  other_name._M_dataplus._M_p._0_4_ = (uint32_t)files._M_h._M_rehash_policy._M_next_resize;
  other_name._M_dataplus._M_p._4_4_ = (int)(files._M_h._M_rehash_policy._M_next_resize >> 0x20);
  lVar8 = files._M_h._M_element_count + 1;
  auVar27._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar27._0_8_ = lVar8;
  auVar27._12_4_ = 0x45300000;
  dVar25 = ceil(((auVar27._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) / dVar25);
  pcVar14 = (char *)((long)dVar25 >> 0x3f);
  __bkt_count = ::std::__detail::_Prime_rehash_policy::_M_next_bkt
                          ((ulong)&files._M_h._M_rehash_policy);
  if (__bkt_count != files._M_h._M_bucket_count) {
    ::std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::_M_rehash(&files._M_h,__bkt_count,(__rehash_state *)&other_name);
    sVar3 = files._M_h._M_rehash_policy._M_next_resize;
  }
  files._M_h._M_rehash_policy._M_next_resize = sVar3;
  uVar23 = 0xffffffff;
  crc.rem_ = boost::detail::super_byte_reflector<32>::reflect_q(0xffffffff);
  crc_00 = (crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *)
           (this->m_files).m_name._M_string_length;
  if (crc_00 != (crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *)0x0) {
    str._M_str = pcVar14;
    str._M_len = (size_t)(this->m_files).m_name._M_dataplus._M_p;
    (anonymous_namespace)::
    process_string_lowercase<boost::crc_optimal<32ul,517762881u,4294967295u,4294967295u,true,true>>
              ((_anonymous_namespace_ *)&crc,crc_00,str);
  }
  pbVar1 = (this->m_files).m_paths.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar21 = (this->m_files).m_paths.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar1; pbVar21 = pbVar21 + 1
      ) {
    local_crc = crc;
    if (pbVar21->_M_string_length == 0) {
      sVar16 = 0;
    }
    else {
      boost::crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true>::process_byte
                (&local_crc,'/');
      sVar16 = pbVar21->_M_string_length;
    }
    uVar24 = (ulong)uVar23;
    pcVar2 = (pbVar21->_M_dataplus)._M_p;
    for (sVar18 = 0; sVar16 != sVar18; sVar18 = sVar18 + 1) {
      c = pcVar2[sVar18];
      if (c == '/') {
        other_name._M_dataplus._M_p._0_4_ = ~local_crc.rem_;
        other_name._M_dataplus._M_p._4_4_ = (int)uVar24;
        other_name._M_string_length._0_4_ = (undefined4)(uVar24 >> 0x20);
        ::std::
        unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
        ::insert(&files,(value_type *)&other_name);
      }
      byte = aux::to_lower(c);
      boost::crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true>::process_byte
                (&local_crc,byte);
      uVar24 = uVar24 + 0x100000000;
    }
    other_name._M_dataplus._M_p._0_4_ = ~local_crc.rem_;
    other_name._M_string_length._0_4_ = (undefined4)pbVar21->_M_string_length;
    other_name._M_dataplus._M_p._4_4_ = uVar23;
    ::std::
    unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
    ::insert(&files,(value_type *)&other_name);
    uVar23 = uVar23 - 1;
  }
  iVar9 = file_storage::file_range(&this->m_files);
  iVar6 = 0;
  iVar22 = iVar9;
LAB_00318b80:
  local_b8 = iVar9._end.m_val;
  index.m_val = (int)iVar22._begin.m_val;
  if (index.m_val != local_b8.m_val) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&other_name,"",(allocator<char> *)&crc);
    uVar7 = file_storage::file_path_hash(&this->m_files,index,&other_name);
    ::std::__cxx11::string::~string((string *)&other_name);
    hash = uVar7;
    _Var10._M_cur =
         (__node_type *)
         ::std::
         _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
         ::find(&files._M_h,&hash);
    _Var19._M_cur = _Var10._M_cur;
    if (_Var10._M_cur == (__node_type *)0x0) {
LAB_00318bf7:
      _Var19._M_cur = (__node_type *)0x0;
    }
    else {
      do {
        _Var19._M_cur = (__node_type *)((_Var19._M_cur)->super__Hash_node_base)._M_nxt;
        if (_Var19._M_cur == (__node_type *)0x0) goto LAB_00318bf7;
      } while (*(anon_struct_4_0_00000001_for___align *)((long)_Var10._M_cur + 8) ==
               ((_Var19._M_cur)->
               super__Hash_node_value<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
               ).
               super__Hash_node_value_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>
               ._M_storage._M_storage.__align);
    }
    while( true ) {
      if (_Var10._M_cur == _Var19._M_cur) break;
      fVar20.m_val = (int)*(undefined8 *)
                           ((long)&((_Var10._M_cur)->
                                   super__Hash_node_value<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>
                                   ._M_storage._M_storage + 4);
      if (fVar20.m_val < 0) {
        pcVar2 = (this->m_files).m_name._M_dataplus._M_p;
        this_00 = (libtorrent *)(this->m_files).m_name._M_string_length;
        ::std::__cxx11::string::substr
                  ((ulong)&crc,
                   (ulong)((this->m_files).m_paths.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (~fVar20.m_val & 0x7fffffff))
                  );
        rhs._M_len._4_4_ = uStack_154;
        rhs._M_len._0_4_ = crc.rem_;
        lhs._M_str = (char *)local_150;
        lhs._M_len = (size_t)pcVar2;
        rhs._M_str = in_R9;
        combine_path_abi_cxx11_(&other_name,this_00,lhs,rhs);
        ::std::__cxx11::string::~string((string *)&crc);
      }
      else {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&crc,"",(allocator<char> *)&local_crc);
        file_storage::file_path(&other_name,&this->m_files,fVar20,(string *)&crc);
        ::std::__cxx11::string::~string((string *)&crc);
      }
      s1._M_str._4_4_ = other_name._M_dataplus._M_p._4_4_;
      s1._M_str._0_4_ = (uint32_t)other_name._M_dataplus._M_p;
      s1._M_len._4_4_ = other_name._M_string_length._4_4_;
      s1._M_len._0_4_ = (undefined4)other_name._M_string_length;
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_crc,"",(allocator<char> *)&ext);
      file_storage::file_path((string *)&crc,&this->m_files,index,(string *)&local_crc);
      s2._M_str._4_4_ = uStack_154;
      s2._M_str._0_4_ = crc.rem_;
      s2._M_len = (size_t)local_150;
      bVar4 = aux::string_equal_no_case(s1,s2);
      ::std::__cxx11::string::~string((string *)&crc);
      ::std::__cxx11::string::~string((string *)&local_crc);
      ::std::__cxx11::string::~string((string *)&other_name);
      if (bVar4) {
        fVar20.m_val = *(int *)((long)&((_Var10._M_cur)->
                                       super__Hash_node_value<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>
                                       ._M_storage._M_storage + 4);
        if (((-1 < fVar20.m_val) &&
            (fVar5 = file_storage::file_flags(&this->m_files,index), (fVar5.m_val & 1) != 0)) &&
           (fVar5 = file_storage::file_flags(&this->m_files,fVar20), (fVar5.m_val & 1) != 0)) {
          iVar11 = file_storage::file_size(&this->m_files,index);
          iVar12 = file_storage::file_size(&this->m_files,fVar20);
          if (iVar11 == iVar12) goto LAB_00318f7e;
        }
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&other_name,"",(allocator<char> *)&local_crc);
        file_storage::file_path((string *)&crc,&this->m_files,index,&other_name);
        ::std::__cxx11::string::~string((string *)&other_name);
        remove_extension((string *)&local_crc,(string *)&crc);
        extension(&ext,(string *)&crc);
        iVar15 = max_duplicate_filenames;
        if (max_duplicate_filenames < iVar6) {
          iVar15 = iVar6;
        }
        pcVar14 = (char *)0x1;
        goto LAB_00318e32;
      }
      _Var10._M_cur = (__node_type *)((_Var10._M_cur)->super__Hash_node_base)._M_nxt;
    }
    other_name._M_string_length._0_4_ = 0;
    other_name._M_dataplus._M_p._0_4_ = uVar7;
    other_name._M_dataplus._M_p._4_4_ = index.m_val;
    ::std::
    unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
    ::insert(&files,(value_type *)&other_name);
    goto LAB_00318f7e;
  }
LAB_00318f86:
  ::std::
  unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
  ::~unordered_multimap(&files);
  return index.m_val == local_b8.m_val;
LAB_00318e32:
  iVar17 = (int)pcVar14;
  snprintf((char *)&other_name,0x32,".%d%s",pcVar14,ext._M_dataplus._M_p);
  ::std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_crc,
                   (char *)&other_name);
  ::std::__cxx11::string::operator=((string *)&crc,(string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  crc_1.rem_ = boost::detail::super_byte_reflector<32>::reflect_q(0xffffffff);
  str_00._M_len._4_4_ = uStack_154;
  str_00._M_len._0_4_ = crc.rem_;
  str_00._M_str = pcVar14;
  (anonymous_namespace)::
  process_string_lowercase<boost::crc_optimal<32ul,517762881u,4294967295u,4294967295u,true,true>>
            ((_anonymous_namespace_ *)&crc_1,local_150,str_00);
  uVar23 = ~crc_1.rem_;
  new_hash = uVar23;
  iVar13 = ::std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
           ::find(&files._M_h,&new_hash);
  if (iVar13.
      super__Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
      ._M_cur == (__node_type *)0x0) goto LAB_00318ee1;
  if (max_duplicate_filenames <= iVar6) {
    boost::system::error_code::operator=(ec,too_many_duplicate_filenames);
    (this->m_files).m_piece_length = 0;
    iVar6 = iVar15 + 1;
    goto LAB_00318f52;
  }
  iVar6 = iVar6 + 1;
  pcVar14 = (char *)(ulong)(iVar17 + 1);
  goto LAB_00318e32;
LAB_00318ee1:
  local_50._M_dataplus._M_p._0_4_ = uVar23;
  local_50._4_8_ = (ulong)iVar22 & 0xffffffff;
  ::std::
  unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
  ::insert(&files,(value_type *)&local_50);
  copy_on_write(this);
  file_storage::rename_file(&this->m_files,index,(string *)&crc);
LAB_00318f52:
  ::std::__cxx11::string::~string((string *)&ext);
  ::std::__cxx11::string::~string((string *)&local_crc);
  ::std::__cxx11::string::~string((string *)&crc);
  if (iVar13.
      super__Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
      ._M_cur != (__node_type *)0x0) goto LAB_00318f86;
LAB_00318f7e:
  iVar22._begin.m_val = index.m_val + 1;
  iVar22._end.m_val = 0;
  goto LAB_00318b80;
}

Assistant:

bool torrent_info::resolve_duplicate_filenames_slow(
		int const max_duplicate_filenames, error_code& ec)
	{
		INVARIANT_CHECK;

		// maps filename hash to file index
		// or, if the file_index is negative, maps into the paths vector
		std::unordered_multimap<std::uint32_t, name_entry> files;

		std::vector<std::string> const& paths = m_files.paths();
		files.reserve(paths.size() + aux::numeric_cast<std::size_t>(m_files.num_files()));

		// insert all directories first, to make sure no files
		// are allowed to collied with them
		{
			boost::crc_optimal<32, 0x1EDC6F41, 0xFFFFFFFF, 0xFFFFFFFF, true, true> crc;
			if (!m_files.name().empty())
			{
				process_string_lowercase(crc, m_files.name());
			}
			file_index_t path_index{-1};
			for (auto const& path : paths)
			{
				auto local_crc = crc;
				if (!path.empty()) local_crc.process_byte(TORRENT_SEPARATOR);
				int count = 0;
				for (char const c : path)
				{
					if (c == TORRENT_SEPARATOR)
						files.insert({local_crc.checksum(), {path_index, count}});
					local_crc.process_byte(aux::to_lower(c) & 0xff);
					++count;
				}
				files.insert({local_crc.checksum(), {path_index, int(path.size())}});
				--path_index;
			}
		}

		// keep track of the total number of name collisions. If there are too
		// many, it's probably a malicious torrent and we should just fail
		int num_collisions = 0;
		for (auto const i : m_files.file_range())
		{
			// as long as this file already exists
			// increase the counter
			std::uint32_t const hash = m_files.file_path_hash(i, "");
			auto range = files.equal_range(hash);
			auto const match = std::find_if(range.first, range.second, [&](std::pair<std::uint32_t, name_entry> const& o)
			{
				std::string const other_name = o.second.idx < file_index_t{}
					? combine_path(m_files.name(), paths[std::size_t(-static_cast<int>(o.second.idx)-1)].substr(0, std::size_t(o.second.length)))
					: m_files.file_path(o.second.idx);
				return aux::string_equal_no_case(other_name, m_files.file_path(i));
			});

			if (match == range.second)
			{
				files.insert({hash, {i, 0}});
				continue;
			}

			// pad files are allowed to collide with each-other, as long as they have
			// the same size.
			file_index_t const other_idx = match->second.idx;
			if (other_idx >= file_index_t{}
				&& (m_files.file_flags(i) & file_storage::flag_pad_file)
				&& (m_files.file_flags(other_idx) & file_storage::flag_pad_file)
				&& m_files.file_size(i) == m_files.file_size(other_idx))
				continue;

			std::string filename = m_files.file_path(i);
			std::string base = remove_extension(filename);
			std::string ext = extension(filename);
			int cnt = 0;
			for (;;)
			{
				++cnt;
				char new_ext[50];
				std::snprintf(new_ext, sizeof(new_ext), ".%d%s", cnt, ext.c_str());
				filename = base + new_ext;

				boost::crc_optimal<32, 0x1EDC6F41, 0xFFFFFFFF, 0xFFFFFFFF, true, true> crc;
				process_string_lowercase(crc, filename);
				std::uint32_t const new_hash = crc.checksum();
				if (files.find(new_hash) == files.end())
				{
					files.insert({new_hash, {i, 0}});
					break;
				}
				++num_collisions;
				if (num_collisions > max_duplicate_filenames)
				{
					ec = errors::too_many_duplicate_filenames;
					// mark the torrent as invalid
					m_files.set_piece_length(0);
					return false;
				}
			}

			copy_on_write();
			m_files.rename_file(i, filename);
		}
		return true;
	}